

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c++
# Opt level: O0

ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> __thiscall
capnp::_::BuilderArena::getSegmentsForOutput(BuilderArena *this)

{
  bool bVar1;
  MultiSegmentState *pMVar2;
  size_t sVar3;
  ArrayPtr<const_capnp::word> *pAVar4;
  SegmentBuilder *this_00;
  BuilderArena *pBVar5;
  ulong uVar6;
  ArrayPtr<kj::ArrayPtr<const_capnp::word>_> local_118;
  ArrayPtr<const_capnp::word> local_108;
  ArrayPtr<const_capnp::word> local_f8;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *local_e8;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *builder;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *__end4;
  Own<capnp::_::SegmentBuilder,_std::nullptr_t> *__begin4;
  Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_> *__range4;
  size_t local_c0;
  uint local_b4;
  undefined1 local_b0 [4];
  uint i;
  ArrayPtr<kj::ArrayPtr<const_capnp::word>_> result;
  size_t local_90;
  size_t local_88;
  Fault local_80;
  Fault f;
  size_t local_70;
  DebugExpression<unsigned_long> local_68;
  undefined1 local_60 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition;
  Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *segmentState;
  Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *_segmentState306;
  BuilderArena *this_local;
  
  _kjCondition._32_8_ =
       kj::_::readMaybe<capnp::_::BuilderArena::MultiSegmentState,decltype(nullptr)>
                 (&this->moreSegments);
  if ((Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)_kjCondition._32_8_ ==
      (Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)0x0) {
    pBVar5 = SegmentBuilder::getArena(&this->segment0);
    if (pBVar5 == (BuilderArena *)0x0) {
      kj::ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_>::ArrayPtr
                ((ArrayPtr<const_kj::ArrayPtr<const_capnp::word>_> *)&this_local,(void *)0x0);
    }
    else {
      local_108 = SegmentBuilder::currentlyAllocated(&this->segment0);
      (this->segment0ForOutput).ptr = local_108.ptr;
      (this->segment0ForOutput).size_ = local_108.size_;
      local_118 = kj::arrayPtr<kj::ArrayPtr<capnp::word_const>>(&this->segment0ForOutput,1);
      _this_local = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)&local_118);
    }
  }
  else {
    pMVar2 = kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>::get
                       ((Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)
                        _kjCondition._32_8_);
    local_70 = kj::Vector<kj::ArrayPtr<const_capnp::word>_>::size(&pMVar2->forOutput);
    local_68 = kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_70);
    pMVar2 = kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>::get
                       ((Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)
                        _kjCondition._32_8_);
    sVar3 = kj::Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::size(&pMVar2->builders);
    f.exception = (Exception *)(sVar3 + 1);
    kj::_::DebugExpression<unsigned_long>::operator==
              ((DebugComparison<unsigned_long,_unsigned_long> *)local_60,&local_68,
               (unsigned_long *)&f);
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_60);
    if (!bVar1) {
      pMVar2 = kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>::get
                         ((Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)
                          _kjCondition._32_8_);
      local_88 = kj::Vector<kj::ArrayPtr<const_capnp::word>_>::size(&pMVar2->forOutput);
      pMVar2 = kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>::get
                         ((Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)
                          _kjCondition._32_8_);
      local_90 = kj::Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::size
                           (&pMVar2->builders);
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[81],unsigned_long,unsigned_long>
                (&local_80,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/arena.c++"
                 ,0x135,FAILED,
                 "segmentState.get()->forOutput.size() == segmentState.get()->builders.size() + 1",
                 "_kjCondition,\"segmentState.forOutput wasn\'t resized correctly when the last builder was added.\", segmentState.get()->forOutput.size(), segmentState.get()->builders.size()"
                 ,(DebugComparison<unsigned_long,_unsigned_long> *)local_60,
                 (char (*) [81])
                 "segmentState.forOutput wasn\'t resized correctly when the last builder was added."
                 ,&local_88,&local_90);
      kj::_::Debug::Fault::fatal(&local_80);
    }
    pMVar2 = kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>::get
                       ((Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)
                        _kjCondition._32_8_);
    pAVar4 = kj::Vector<kj::ArrayPtr<const_capnp::word>_>::operator[](&pMVar2->forOutput,0);
    pMVar2 = kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>::get
                       ((Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)
                        _kjCondition._32_8_);
    sVar3 = kj::Vector<kj::ArrayPtr<const_capnp::word>_>::size(&pMVar2->forOutput);
    kj::ArrayPtr<kj::ArrayPtr<const_capnp::word>_>::ArrayPtr
              ((ArrayPtr<kj::ArrayPtr<const_capnp::word>_> *)local_b0,pAVar4,sVar3);
    local_b4 = 0;
    ___range4 = SegmentBuilder::currentlyAllocated(&this->segment0);
    uVar6 = (ulong)local_b4;
    local_b4 = local_b4 + 1;
    pAVar4 = kj::ArrayPtr<kj::ArrayPtr<const_capnp::word>_>::operator[]
                       ((ArrayPtr<kj::ArrayPtr<const_capnp::word>_> *)local_b0,uVar6);
    pAVar4->ptr = (word *)__range4;
    pAVar4->size_ = local_c0;
    __begin4 = (Own<capnp::_::SegmentBuilder,_std::nullptr_t> *)
               kj::Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t>::get
                         ((Own<capnp::_::BuilderArena::MultiSegmentState,_std::nullptr_t> *)
                          _kjCondition._32_8_);
    __end4 = kj::Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::begin
                       ((Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_> *)__begin4);
    builder = kj::Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_>::end
                        ((Vector<kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>_> *)__begin4);
    for (; __end4 != builder; __end4 = __end4 + 1) {
      local_e8 = __end4;
      this_00 = kj::Own<capnp::_::SegmentBuilder,_std::nullptr_t>::operator->(__end4);
      local_f8 = SegmentBuilder::currentlyAllocated(this_00);
      uVar6 = (ulong)local_b4;
      local_b4 = local_b4 + 1;
      pAVar4 = kj::ArrayPtr<kj::ArrayPtr<const_capnp::word>_>::operator[]
                         ((ArrayPtr<kj::ArrayPtr<const_capnp::word>_> *)local_b0,uVar6);
      pAVar4->ptr = local_f8.ptr;
      pAVar4->size_ = local_f8.size_;
    }
    _this_local = kj::ArrayPtr::operator_cast_to_ArrayPtr((ArrayPtr *)local_b0);
  }
  return _this_local;
}

Assistant:

kj::ArrayPtr<const kj::ArrayPtr<const word>> BuilderArena::getSegmentsForOutput() {
  // Although this is a read-only method, we shouldn't need to lock a mutex here because if this
  // is called multiple times simultaneously, we should only be overwriting the array with the
  // exact same data.  If the number or size of segments is actually changing due to an activity
  // in another thread, then the caller has a problem regardless of locking here.

  KJ_IF_SOME(segmentState, moreSegments) {
    KJ_DASSERT(segmentState.get()->forOutput.size() == segmentState.get()->builders.size() + 1,
        "segmentState.forOutput wasn't resized correctly when the last builder was added.",
        segmentState.get()->forOutput.size(), segmentState.get()->builders.size());

    kj::ArrayPtr<kj::ArrayPtr<const word>> result(
        &segmentState.get()->forOutput[0], segmentState.get()->forOutput.size());
    uint i = 0;
    result[i++] = segment0.currentlyAllocated();
    for (auto& builder: segmentState.get()->builders) {
      result[i++] = builder->currentlyAllocated();
    }
    return result;
  } else {
    if (segment0.getArena() == nullptr) {
      // We haven't actually allocated any segments yet.
      return nullptr;
    } else {
      // We have only one segment so far.
      segment0ForOutput = segment0.currentlyAllocated();
      return kj::arrayPtr(&segment0ForOutput, 1);
    }
  }
}